

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

OptionStatus
getLocalOptionType(HighsLogOptions *report_log_options,string *option,
                  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                  HighsOptionType *type)

{
  OptionStatus OVar1;
  undefined8 in_RAX;
  HighsInt index;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  OVar1 = getOptionIndex(report_log_options,option,option_records,&local_14);
  if ((OVar1 == kOk) && (OVar1 = kOk, type != (HighsOptionType *)0x0)) {
    *type = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
            _M_impl.super__Vector_impl_data._M_start[local_14]->type;
  }
  return OVar1;
}

Assistant:

OptionStatus getLocalOptionType(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records, HighsOptionType* type) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  if (type) *type = option_records[index]->type;
  return OptionStatus::kOk;
}